

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  undefined4 extraout_XMM0_Db;
  double dVar1;
  undefined4 uVar2;
  float *output;
  int n;
  int k;
  int i;
  int comp_local;
  int y_local;
  int x_local;
  stbi_uc *data_local;
  
  if (data == (stbi_uc *)0x0) {
    data_local = (stbi_uc *)0x0;
  }
  else {
    data_local = (stbi_uc *)stbi__malloc_mad4(x,y,comp,4,0);
    if (data_local == (stbi_uc *)0x0) {
      free(data);
      stbi__err("outofmem");
      data_local = (stbi_uc *)0x0;
    }
    else {
      output._0_4_ = comp;
      if ((comp & 1U) == 0) {
        output._0_4_ = comp + -1;
      }
      uVar2 = extraout_XMM0_Db;
      for (n = 0; n < x * y; n = n + 1) {
        for (output._4_4_ = 0; output._4_4_ < (int)output; output._4_4_ = output._4_4_ + 1) {
          dVar1 = std::pow((double)CONCAT44(uVar2,(float)data[n * comp + output._4_4_] / 255.0),
                           (double)(ulong)(uint)stbi__l2h_gamma);
          uVar2 = (undefined4)((ulong)dVar1 >> 0x20);
          *(float *)(data_local + (long)(n * comp + output._4_4_) * 4) =
               SUB84(dVar1,0) * stbi__l2h_scale;
        }
      }
      if ((int)output < comp) {
        for (n = 0; n < x * y; n = n + 1) {
          *(float *)(data_local + (long)(n * comp + (int)output) * 4) =
               (float)data[n * comp + (int)output] / 255.0;
        }
      }
      free(data);
    }
  }
  return (float *)data_local;
}

Assistant:

static float   *stbi__ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output;
   if (!data) return NULL;
   output = (float *) stbi__malloc_mad4(x, y, comp, sizeof(float), 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) (pow(data[i*comp+k]/255.0f, stbi__l2h_gamma) * stbi__l2h_scale);
      }
   }
   if (n < comp) {
      for (i=0; i < x*y; ++i) {
         output[i*comp + n] = data[i*comp + n]/255.0f;
      }
   }
   STBI_FREE(data);
   return output;
}